

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O2

Image * ImageIO::readImage(string *fileName)

{
  __type _Var1;
  uint width;
  uint height;
  FILE *__stream;
  uchar *imageInfo;
  ostream *poVar2;
  uchar *data;
  Image *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  undefined8 extraout_RDX_02;
  int i;
  long lVar4;
  uint dataSize;
  string bmpStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string imageHeightStr;
  string imageWidthStr;
  
  __stream = fopen((fileName->_M_dataplus)._M_p,"rb+");
  if (__stream != (FILE *)0x0) {
    imageInfo = (uchar *)operator_new__(0x36);
    fread(imageInfo,1,0x36,__stream);
    imageWidthStr._M_dataplus._M_p = (pointer)&imageWidthStr.field_2;
    imageWidthStr._M_string_length = 0;
    imageWidthStr.field_2._M_local_buf[0] = '\0';
    imageHeightStr._M_dataplus._M_p = (pointer)&imageHeightStr.field_2;
    imageHeightStr._M_string_length = 0;
    imageHeightStr.field_2._M_local_buf[0] = '\0';
    uVar3 = extraout_RDX;
    for (lVar4 = 0x12; lVar4 != 0x16; lVar4 = lVar4 + 1) {
      Tools::Char2Hex_abi_cxx11_(&bmpStr,(Tools *)(ulong)imageInfo[lVar4],(uchar)uVar3);
      std::__cxx11::string::insert((ulong)&imageWidthStr,(string *)0x0);
      std::__cxx11::string::~string((string *)&bmpStr);
      uVar3 = extraout_RDX_00;
    }
    width = std::__cxx11::stoi(&imageWidthStr,(size_t *)0x0,0x10);
    uVar3 = extraout_RDX_01;
    for (lVar4 = 0x16; lVar4 != 0x1a; lVar4 = lVar4 + 1) {
      Tools::Char2Hex_abi_cxx11_(&bmpStr,(Tools *)(ulong)imageInfo[lVar4],(uchar)uVar3);
      std::__cxx11::string::insert((ulong)&imageHeightStr,(string *)0x0);
      std::__cxx11::string::~string((string *)&bmpStr);
      uVar3 = extraout_RDX_02;
    }
    height = std::__cxx11::stoi(&imageHeightStr,(size_t *)0x0,0x10);
    std::__cxx11::string::string((string *)&bmpStr,"yuv",(allocator *)&local_90);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)fileName);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_90);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)fileName);
    _Var1 = std::operator==(&local_90,&bmpStr);
    std::__cxx11::string::~string((string *)&local_90);
    dataSize = width * height * 3 >> _Var1;
    fseek(__stream,0x36,0);
    data = (uchar *)operator_new__((ulong)dataSize);
    fread(data,1,(ulong)dataSize,__stream);
    fclose(__stream);
    this = (Image *)operator_new(0x20);
    Image::Image(this,imageInfo,data,width,height,dataSize);
    std::__cxx11::string::~string((string *)&bmpStr);
    std::__cxx11::string::~string((string *)&imageHeightStr);
    std::__cxx11::string::~string((string *)&imageWidthStr);
    return this;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_72aa);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

Image * ImageIO::readImage(string & fileName){
	FILE * imageFile = fopen(fileName.c_str(), "rb+");	
	if(imageFile == nullptr){
		cout<<"空文件"<<endl;
		exit(EXIT_FAILURE);
	}

	//读文件头
	uchar * imageInfo = new uchar[imageInfoHeadSize];
	fread(imageInfo, sizeof(uchar), imageInfoHeadSize, imageFile);


	uint width, height, dataSize;
	string imageWidthStr, imageHeightStr;

	for(int i = imageWidthPosition; i < imageWidthPosition + 4; i++){
		imageWidthStr.insert(0, Tools::Char2Hex(imageInfo[i]));
	}
	width = stoi(imageWidthStr, nullptr, 16);

	for(int i = imageHeightPosition; i < imageHeightPosition + 4; i++){
		imageHeightStr.insert(0, Tools::Char2Hex(imageInfo[i]));
	}
	height = stoi(imageHeightStr, nullptr, 16);

	string bmpStr = "yuv";
	cout<<fileName.substr(fileName.length()-3, 3)<<endl;
	if(fileName.substr(fileName.length()-3, 3) == bmpStr){
		dataSize = (width * height * 3) / 2;
	}else{
		dataSize = width * height * 3;
	}
	
	//cout<<"dataSize:"<<dataSize<<endl;

	//读图像数据
	fseek(imageFile, imageInfoHeadSize, 0);
	uchar * data = new uchar[dataSize];
	fread(data, sizeof(uchar), dataSize, imageFile);
	fclose(imageFile);

	Image * image = new Image(imageInfo, data, width, height, dataSize);

	return image;
}